

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O3

void __thiscall Kumu::MemIOWriter::MemIOWriter(MemIOWriter *this,ByteString *Buf)

{
  ui32_t uVar1;
  
  this->m_p = (byte_t *)0x0;
  this->m_capacity = 0;
  this->m_size = 0;
  if (Buf->m_Data == (byte_t *)0x0) {
    __assert_fail("m_Data",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.h"
                  ,0x224,"byte_t *Kumu::ByteString::Data()");
  }
  this->m_p = Buf->m_Data;
  uVar1 = Buf->m_Capacity;
  this->m_capacity = uVar1;
  if (uVar1 != 0) {
    return;
  }
  __assert_fail("m_capacity",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.cpp"
                ,0x415,"Kumu::MemIOWriter::MemIOWriter(ByteString *)");
}

Assistant:

Kumu::MemIOWriter::MemIOWriter(ByteString* Buf)
  : m_p(0), m_capacity(0), m_size(0)
{
  m_p = Buf->Data();
  m_capacity = Buf->Capacity();
  assert(m_p); assert(m_capacity);
}